

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O3

QString * RelocEntryWrapper::translateType(QString *__return_storage_ptr__,WORD type)

{
  undefined6 in_register_00000032;
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  switch(CONCAT62(in_register_00000032,type) & 0xffffffff) {
  case 0:
    psVar1 = (storage_type *)0x11;
    break;
  case 1:
    goto LAB_001366b3;
  case 2:
LAB_001366b3:
    psVar1 = (storage_type *)0x19;
    break;
  case 3:
    goto LAB_001366ef;
  case 4:
    psVar1 = (storage_type *)0x7;
    break;
  case 5:
    psVar1 = (storage_type *)0xd;
    break;
  case 6:
  case 7:
    psVar1 = (storage_type *)0x8;
    break;
  default:
    psVar1 = (storage_type *)0x0;
    break;
  case 9:
    psVar1 = (storage_type *)0xf;
    break;
  case 10:
LAB_001366ef:
    psVar1 = (storage_type *)0xc;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = pcStack_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString RelocEntryWrapper::translateType(WORD type)
{
    switch (type) {
        case 0 : return "Padding (skipped)";
        case 1 : return "High WORD of 32-bit field";
        case 2 : return "Low  WORD of 32-bit field";
        case 3 : return "32 bit field";
        case 4 : return "HighAdj";
        case 5 : return "MIPS JumpAddr";
        case 6 : case 7 : return "Reserved";
        case 9 : return "MIPS16 JumpAddr";
        case 10 : return "64 bit field";
    }
    return "";
}